

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnUUID::ColumnUUID(ColumnUUID *this)

{
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffd8;
  Column *in_stack_ffffffffffffffe0;
  
  Type::CreateUUID();
  Column::Column(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x23b9eb);
  *in_RDI = &PTR__ColumnUUID_002a0850;
  std::make_shared<clickhouse::ColumnVector<unsigned_long>>();
  return;
}

Assistant:

ColumnUUID::ColumnUUID()
    : Column(Type::CreateUUID())
    , data_(std::make_shared<ColumnUInt64>())
{
}